

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O2

int ASN1_TYPE_get(ASN1_TYPE *a)

{
  uint uVar1;
  
  uVar1 = a->type;
  if ((uVar1 | 4) == 5) {
    return uVar1;
  }
  if ((a->value).ptr == (char *)0x0) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int ASN1_TYPE_get(const ASN1_TYPE *a) {
  switch (a->type) {
    case V_ASN1_NULL:
    case V_ASN1_BOOLEAN:
      return a->type;
    case V_ASN1_OBJECT:
      return a->value.object != NULL ? a->type : 0;
    default:
      return a->value.asn1_string != NULL ? a->type : 0;
  }
}